

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::SimpleTypeHandler<1UL>::GetPropertyEquivalenceInfo
          (SimpleTypeHandler<1UL> *this,PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info
          )

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  PropertyIndex PVar4;
  ushort uVar5;
  
  if (0 < this->propertyCount) {
    uVar3 = 0;
    do {
      uVar2 = uVar3 & 0xffff;
      if (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar2 << 4)) + 8) ==
          propertyRecord->pid) {
        if ((*(byte *)((long)&this->descriptors[0].field_1 + (ulong)(uVar2 << 4)) & 8) == 0) {
          if (uVar2 == 0xffff) {
            PVar4 = 0xffff;
          }
          else {
            uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
            uVar5 = -uVar1;
            if ((ushort)uVar3 < uVar1) {
              uVar5 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
            }
            PVar4 = uVar5 + (ushort)uVar3;
          }
          info->slotIndex = PVar4;
          info->isWritable =
               (bool)(*(byte *)((long)&this->descriptors[0].field_1 + (ulong)(uVar2 << 4)) >> 2 & 1)
          ;
          return true;
        }
        break;
      }
      uVar3 = uVar2 + 1;
    } while ((uVar3 & 0xffff) < (uint)this->propertyCount);
  }
  info->slotIndex = 0xffff;
  info->isWritable = true;
  return false;
}

Assistant:

bool SimpleTypeHandler<size>::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        PropertyIndex index;
        if (GetDescriptor(propertyRecord->GetPropertyId(), &index) && !(descriptors[index].Attributes & PropertyDeleted))
        {
            info.slotIndex = AdjustSlotIndexForInlineSlots((PropertyIndex)index);
            info.isWritable = !!(descriptors[index].Attributes & PropertyWritable);
            return true;
        }
        else
        {
            info.slotIndex = Constants::NoSlot;
            info.isWritable = true;
            return false;
        }
    }